

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

FenceWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateFence
          (FenceWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,VkFenceCreateInfo *FenceCI
          ,char *DebugName)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkFenceCreateInfo *FenceCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (FenceCI->sType != VK_STRUCTURE_TYPE_FENCE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[53]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"FenceCI.sType == VK_STRUCTURE_TYPE_FENCE_CREATE_INFO",
               (char (*) [53])DebugName);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xe0);
    std::__cxx11::string::~string((string *)local_48);
  }
  CreateVulkanObject<VkFence_T*,(VulkanUtilities::VulkanHandleTypeId)7,VkResult(*)(VkDevice_T*,VkFenceCreateInfo_const*,VkAllocationCallbacks_const*,VkFence_T**),VkFenceCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkFenceCreateInfo_ptr_VkAllocationCallbacks_ptr_VkFence_T_ptr_ptr
              *)vkCreateFence,FenceCI,(char *)msg.field_2._8_8_,"fence");
  return __return_storage_ptr__;
}

Assistant:

FenceWrapper VulkanLogicalDevice::CreateFence(const VkFenceCreateInfo& FenceCI, const char* DebugName) const
{
    VERIFY_EXPR(FenceCI.sType == VK_STRUCTURE_TYPE_FENCE_CREATE_INFO);
    return CreateVulkanObject<VkFence, VulkanHandleTypeId::Fence>(vkCreateFence, FenceCI, DebugName, "fence");
}